

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCreateFromGias(char *pName,Vec_Ptr_t *vGias,Gia_Man_t *pMulti)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  void **ppvVar7;
  Abc_Ntk_t *pNtk;
  char *pcVar8;
  Abc_Obj_t *pAVar9;
  Vec_Int_t *pVVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  Gia_Man_t *pGVar17;
  
  pGVar17 = pMulti;
  if (pMulti == (Gia_Man_t *)0x0) {
    if (vGias->nSize < 1) {
LAB_0086e624:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pGVar17 = (Gia_Man_t *)*vGias->pArray;
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar8 = Extra_UtilStrsav(pName);
  pNtk->pName = pcVar8;
  if (0 < pGVar17->vCis->nSize) {
    iVar13 = 0;
    do {
      Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      iVar13 = iVar13 + 1;
    } while (iVar13 < pGVar17->vCis->nSize);
  }
  if (pMulti == (Gia_Man_t *)0x0) {
    if (0 < vGias->nSize) {
      lVar12 = 0;
      do {
        pGVar17 = (Gia_Man_t *)vGias->pArray[lVar12];
        if (pGVar17->vCos->nSize != 1) {
          __assert_fail("Gia_ManCoNum(pGia) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                        ,0x8f4,"Abc_Ntk_t *Abc_NtkCreateFromGias(char *, Vec_Ptr_t *, Gia_Man_t *)")
          ;
        }
        Gia_ManCleanValue(pGVar17);
        lVar14 = (long)pGVar17->vCis->nSize;
        if (lVar14 < 1) {
          iVar13 = pGVar17->nObjs;
          if (0 < iVar13) goto LAB_0086e2b3;
        }
        else {
          piVar4 = pGVar17->vCis->pArray;
          lVar15 = 0;
          do {
            iVar1 = piVar4[lVar15];
            if (((long)iVar1 < 0) || (iVar13 = pGVar17->nObjs, iVar13 <= iVar1)) goto LAB_0086e643;
            if (pGVar17->pObjs == (Gia_Obj_t *)0x0) break;
            if (pNtk->vCis->nSize <= lVar15) goto LAB_0086e624;
            pGVar17->pObjs[iVar1].Value = *(uint *)((long)pNtk->vCis->pArray[lVar15] + 0x10);
            lVar15 = lVar15 + 1;
          } while (lVar14 != lVar15);
LAB_0086e2b3:
          lVar15 = 8;
          lVar14 = 0;
          do {
            pGVar5 = pGVar17->pObjs;
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            uVar6 = *(ulong *)((long)pGVar5 + lVar15 + -8);
            if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
              iVar13 = *(int *)((long)pGVar5 +
                               lVar15 + (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3);
              if ((long)iVar13 < 0) goto LAB_0086e624;
              uVar2 = pNtk->vObjs->nSize;
              if ((int)uVar2 <= iVar13) goto LAB_0086e624;
              uVar16 = *(uint *)((long)pGVar5 +
                                lVar15 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3);
              if (((long)(int)uVar16 < 0) || (uVar2 <= uVar16)) goto LAB_0086e624;
              ppvVar7 = pNtk->vObjs->pArray;
              pAVar9 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                                  (Abc_Obj_t *)
                                  ((ulong)((uint)(uVar6 >> 0x1d) & 1) ^ (ulong)ppvVar7[iVar13]),
                                  (Abc_Obj_t *)
                                  ((ulong)((uint)(uVar6 >> 0x3d) & 1) ^ (ulong)ppvVar7[(int)uVar16])
                                 );
              *(int *)(&pGVar5->field_0x0 + lVar15) = pAVar9->Id;
              iVar13 = pGVar17->nObjs;
            }
            lVar14 = lVar14 + 1;
            lVar15 = lVar15 + 0xc;
          } while (lVar14 < iVar13);
        }
        if (pGVar17->vCos->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = *pGVar17->vCos->pArray;
        if (((long)(int)uVar2 < 0) || (iVar13 <= (int)uVar2)) goto LAB_0086e643;
        pGVar5 = pGVar17->pObjs + (int)uVar2;
        uVar16 = (uint)*(undefined8 *)pGVar5;
        if (uVar2 == (uVar16 & 0x1fffffff)) {
          pAVar9 = Abc_AigConst1(pNtk);
          pvVar11 = (void *)((ulong)pAVar9 ^ 1);
          uVar16 = (uint)*(undefined8 *)pGVar5;
        }
        else {
          uVar2 = pGVar5[-(ulong)(uVar16 & 0x1fffffff)].Value;
          if (((long)(int)uVar2 < 0) || (pNtk->vObjs->nSize <= (int)uVar2)) goto LAB_0086e624;
          pvVar11 = pNtk->vObjs->pArray[(int)uVar2];
        }
        pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar9,(Abc_Obj_t *)((ulong)(uVar16 >> 0x1d & 1) ^ (ulong)pvVar11));
        lVar12 = lVar12 + 1;
      } while (lVar12 < vGias->nSize);
    }
    goto LAB_0086e602;
  }
  Gia_ManCleanValue(pGVar17);
  lVar12 = (long)pGVar17->vCis->nSize;
  piVar4 = &pGVar17->nObjs;
  if (lVar12 < 1) {
    iVar13 = pGVar17->nObjs;
    if (0 < iVar13) goto LAB_0086e45b;
  }
  else {
    piVar3 = pGVar17->vCis->pArray;
    lVar14 = 0;
    do {
      iVar1 = piVar3[lVar14];
      if (((long)iVar1 < 0) || (iVar13 = *piVar4, iVar13 <= iVar1)) goto LAB_0086e643;
      if (pGVar17->pObjs == (Gia_Obj_t *)0x0) break;
      if (pNtk->vCis->nSize <= lVar14) goto LAB_0086e624;
      pGVar17->pObjs[iVar1].Value = *(uint *)((long)pNtk->vCis->pArray[lVar14] + 0x10);
      lVar14 = lVar14 + 1;
    } while (lVar12 != lVar14);
LAB_0086e45b:
    lVar14 = 8;
    lVar12 = 0;
    do {
      pGVar5 = pGVar17->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar6 = *(ulong *)((long)pGVar5 + lVar14 + -8);
      if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
        iVar13 = *(int *)((long)pGVar5 + lVar14 + (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3
                         );
        if ((long)iVar13 < 0) goto LAB_0086e624;
        uVar2 = pNtk->vObjs->nSize;
        if ((int)uVar2 <= iVar13) goto LAB_0086e624;
        uVar16 = *(uint *)((long)pGVar5 + lVar14 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3)
        ;
        if (((long)(int)uVar16 < 0) || (uVar2 <= uVar16)) goto LAB_0086e624;
        ppvVar7 = pNtk->vObjs->pArray;
        pAVar9 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)((uint)(uVar6 >> 0x1d) & 1) ^ (ulong)ppvVar7[iVar13]),
                            (Abc_Obj_t *)
                            ((ulong)((uint)(uVar6 >> 0x3d) & 1) ^ (ulong)ppvVar7[(int)uVar16]));
        *(int *)(&pGVar5->field_0x0 + lVar14) = pAVar9->Id;
        iVar13 = *piVar4;
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar12 < iVar13);
  }
  pVVar10 = pGVar17->vCos;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      uVar2 = pVVar10->pArray[lVar12];
      if (((long)(int)uVar2 < 0) || (*piVar4 <= (int)uVar2)) {
LAB_0086e643:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar17->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = pGVar17->pObjs + (int)uVar2;
      uVar16 = (uint)*(undefined8 *)pGVar5;
      if (uVar2 == (uVar16 & 0x1fffffff)) {
        pAVar9 = Abc_AigConst1(pNtk);
        pvVar11 = (void *)((ulong)pAVar9 ^ 1);
        uVar16 = (uint)*(undefined8 *)pGVar5;
      }
      else {
        uVar2 = pGVar5[-(ulong)(uVar16 & 0x1fffffff)].Value;
        if (((long)(int)uVar2 < 0) || (pNtk->vObjs->nSize <= (int)uVar2)) goto LAB_0086e624;
        pvVar11 = pNtk->vObjs->pArray[(int)uVar2];
      }
      pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar9,(Abc_Obj_t *)((ulong)(uVar16 >> 0x1d & 1) ^ (ulong)pvVar11));
      lVar12 = lVar12 + 1;
      pVVar10 = pGVar17->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
LAB_0086e602:
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateFromGias( char * pName, Vec_Ptr_t * vGias, Gia_Man_t * pMulti )
{
    Gia_Man_t * pGia = pMulti ? pMulti : (Gia_Man_t *)Vec_PtrEntry(vGias, 0);
    Abc_Ntk_t * pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    Abc_Obj_t * pAbcObj, * pAbcObjPo;
    Gia_Obj_t * pObj; int i, k;
    pNtk->pName = Extra_UtilStrsav( pName );
    for ( k = 0; k < Gia_ManCiNum(pGia); k++ )
        Abc_NtkCreatePi( pNtk );
    if ( pMulti )
    {
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        Gia_ManForEachCo( pGia, pObj, k )
        {
            //pObj = Gia_ManCo(pGia, 0);
            if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
                pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
            else
                pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
            pAbcObjPo = Abc_NtkCreatePo( pNtk );
            Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
        }
    }
    else
    {
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pGia, i )
    {
        assert( Gia_ManCoNum(pGia) == 1 );
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        pObj = Gia_ManCo(pGia, 0);
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
        else
            pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
        pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
        pAbcObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
    }
    }
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    return pNtk;
}